

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O3

void soplex::
     SPxQuicksort<soplex::SPxPricer<double>::IdxElement,soplex::SPxPricer<double>::IdxCompare>
               (IdxElement *keys,int end,IdxCompare *compare,int start,bool type)

{
  IdxElement *pIVar1;
  IdxElement *pIVar2;
  IdxElement *pIVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  double dVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  double *pdVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  IdxElement tmp;
  
  if (start + 1 < end) {
    uVar20 = end - 1;
    uVar12 = uVar20 - start;
    if (0x18 < (int)uVar12) {
LAB_0020c00b:
      iVar13 = (uVar12 >> 1) + start;
      pIVar1 = keys + iVar13;
      dVar4 = keys[iVar13].val;
      lVar16 = (long)(int)uVar20;
      lVar15 = (long)start;
      uVar10 = uVar20;
      uVar12 = start;
      do {
        uVar11 = (ulong)uVar10;
        uVar19 = uVar12;
        if ((type & 1U) == 0) {
          if ((int)uVar12 < (int)uVar20) {
            pdVar17 = &keys[(int)uVar12].val;
            lVar18 = 0;
            do {
              dVar5 = *pdVar17;
              if (((dVar5 != dVar4) || (NAN(dVar5) || NAN(dVar4))) && (0.0 < dVar4 - dVar5)) {
                uVar19 = uVar12 - (int)lVar18;
                break;
              }
              lVar18 = lVar18 + -1;
              pdVar17 = pdVar17 + 2;
              uVar19 = uVar20;
            } while (-lVar16 + (long)(int)uVar12 != lVar18);
          }
          if (start < (int)uVar10) {
            uVar11 = (ulong)(int)uVar10;
            pdVar17 = &keys[uVar11].val;
            do {
              if (dVar4 < *pdVar17 || dVar4 == *pdVar17) goto LAB_0020c113;
              uVar11 = uVar11 - 1;
              pdVar17 = pdVar17 + -2;
            } while (lVar15 < (long)uVar11);
            goto LAB_0020c111;
          }
        }
        else {
          if ((int)uVar12 < (int)uVar20) {
            pdVar17 = &keys[(int)uVar12].val;
            lVar18 = 0;
            do {
              if (*pdVar17 <= dVar4) {
                uVar19 = uVar12 - (int)lVar18;
                break;
              }
              lVar18 = lVar18 + -1;
              pdVar17 = pdVar17 + 2;
              uVar19 = uVar20;
            } while (-lVar16 + (long)(int)uVar12 != lVar18);
          }
          if (start < (int)uVar10) {
            uVar11 = (ulong)(int)uVar10;
            pdVar17 = &keys[uVar11].val;
            do {
              dVar5 = *pdVar17;
              if (((dVar5 != dVar4) || (NAN(dVar5) || NAN(dVar4))) && (dVar4 - dVar5 < 0.0))
              goto LAB_0020c113;
              uVar11 = uVar11 - 1;
              pdVar17 = pdVar17 + -2;
            } while (lVar15 < (long)uVar11);
LAB_0020c111:
            uVar11 = (ulong)(uint)start;
          }
        }
LAB_0020c113:
        uVar10 = (uint)uVar11;
        if ((int)uVar10 <= (int)uVar19) goto LAB_0020c14e;
        pIVar2 = keys + (int)uVar19;
        iVar13 = pIVar2->idx;
        uVar9 = *(undefined4 *)&pIVar2->field_0x4;
        dVar5 = pIVar2->val;
        pIVar2 = keys + (int)uVar10;
        uVar8 = *(undefined4 *)&pIVar2->field_0x4;
        dVar7 = pIVar2->val;
        pIVar3 = keys + (int)uVar19;
        pIVar3->idx = pIVar2->idx;
        *(undefined4 *)&pIVar3->field_0x4 = uVar8;
        pIVar3->val = dVar7;
        pIVar2 = keys + (int)uVar10;
        pIVar2->idx = iVar13;
        *(undefined4 *)&pIVar2->field_0x4 = uVar9;
        pIVar2->val = dVar5;
        uVar12 = uVar19 + 1;
        uVar10 = uVar10 - 1;
      } while( true );
    }
LAB_0020c281:
    if (0 < (int)uVar12) {
      SPxShellsort<soplex::SPxPricer<double>::IdxElement,soplex::SPxPricer<double>::IdxCompare>
                (keys,uVar20,compare,start);
      return;
    }
  }
  return;
LAB_0020c14e:
  if ((type & 1U) == 0) {
    if (start < (int)uVar10) {
      uVar11 = (ulong)(int)uVar10;
      pdVar17 = &keys[uVar11].val;
      do {
        dVar5 = *pdVar17;
        if (((dVar4 != dVar5) || (NAN(dVar4) || NAN(dVar5))) && (0.0 < dVar5 - dVar4))
        goto LAB_0020c1cd;
        uVar11 = uVar11 - 1;
        pdVar17 = pdVar17 + -2;
      } while (lVar15 < (long)uVar11);
      uVar11 = (ulong)(uint)start;
    }
LAB_0020c1cd:
    uVar10 = (uint)uVar11;
    if (uVar10 == uVar20) {
      pIVar2 = keys + lVar16;
      iVar13 = pIVar2->idx;
      uVar9 = *(undefined4 *)&pIVar2->field_0x4;
      dVar4 = pIVar2->val;
      uVar8 = *(undefined4 *)&pIVar1->field_0x4;
      dVar5 = pIVar1->val;
      pIVar2 = keys + lVar16;
      pIVar2->idx = pIVar1->idx;
      *(undefined4 *)&pIVar2->field_0x4 = uVar8;
      pIVar2->val = dVar5;
      pIVar1->idx = iVar13;
      *(undefined4 *)&pIVar1->field_0x4 = uVar9;
      pIVar1->val = dVar4;
      uVar10 = uVar20 - 1;
    }
  }
  else {
    uVar12 = uVar19;
    if ((int)uVar19 < (int)uVar20) {
      pdVar17 = &keys[(int)uVar19].val;
      lVar18 = 0;
      do {
        dVar5 = *pdVar17;
        if (((dVar4 != dVar5) || (NAN(dVar4) || NAN(dVar5))) && (dVar5 - dVar4 < 0.0)) {
          uVar12 = uVar19 - (int)lVar18;
          break;
        }
        lVar18 = lVar18 + -1;
        pdVar17 = pdVar17 + 2;
        uVar12 = uVar20;
      } while ((int)uVar19 - lVar16 != lVar18);
    }
    uVar19 = uVar12;
    if (uVar19 == start) {
      pIVar2 = keys + lVar15;
      iVar13 = pIVar2->idx;
      uVar9 = *(undefined4 *)&pIVar2->field_0x4;
      dVar4 = pIVar2->val;
      uVar8 = *(undefined4 *)&pIVar1->field_0x4;
      dVar5 = pIVar1->val;
      pIVar2 = keys + lVar15;
      pIVar2->idx = pIVar1->idx;
      *(undefined4 *)&pIVar2->field_0x4 = uVar8;
      pIVar2->val = dVar5;
      pIVar1->idx = iVar13;
      *(undefined4 *)&pIVar1->field_0x4 = uVar9;
      pIVar1->val = dVar4;
      uVar19 = start + 1;
    }
  }
  uVar12 = uVar10 - start;
  uVar14 = uVar20 - uVar19;
  if ((int)uVar14 < (int)uVar12) {
    bVar6 = (int)uVar20 <= (int)uVar19;
    uVar21 = uVar10;
    uVar14 = uVar12;
    uVar10 = uVar20;
    uVar20 = uVar19;
    uVar19 = start;
    if (bVar6) goto LAB_0020c26c;
  }
  else {
    bVar6 = (int)uVar10 <= start;
    uVar21 = uVar20;
    uVar12 = uVar14;
    uVar20 = start;
    start = uVar19;
    if (bVar6) goto LAB_0020c26c;
  }
  SPxQuicksort<soplex::SPxPricer<double>::IdxElement,soplex::SPxPricer<double>::IdxCompare>
            (keys,uVar10 + 1,compare,uVar20,(bool)(~type & 1));
  uVar12 = uVar14;
  start = uVar19;
LAB_0020c26c:
  uVar20 = uVar21;
  type = (bool)(type ^ 1);
  if ((int)uVar12 < 0x19) goto LAB_0020c281;
  goto LAB_0020c00b;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}